

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::generate_verilog_no_pkg_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,kratos *this,Generator *top,SystemVerilogCodeGenOptions *options)

{
  _Rb_tree_header *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__return_storage_ptr___00;
  pointer *pptVar2;
  pointer ptVar3;
  pointer ppVar4;
  pointer pfVar5;
  uint32_t uVar6;
  int iVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  infinite_counter<unsigned_long,_18446744073709551615UL> *__args_1;
  ulong uVar8;
  priority_task *ppVar9;
  pointer ppVar10;
  _Base_ptr p_Var11;
  runtime_error *this_01;
  undefined1 this_02 [8];
  infinite_counter<unsigned_long,_18446744073709551615UL> *in_R8;
  ulong uVar12;
  ulong __n;
  undefined1 local_238 [8];
  UniqueGeneratorVisitor unique_visitor;
  thread_pool pool;
  undefined1 auStack_b8 [8];
  vector<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  tasks;
  undefined1 local_98 [8];
  future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  t;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  r;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  unique_visitor.super_IRVisitor._8_8_ =
       &unique_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  unique_visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  unique_visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  unique_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_238 = (undefined1  [8])&PTR_visit_root_002b5690;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&unique_visitor.generator_map_;
  unique_visitor.generator_map_._M_t._M_impl._0_4_ = 0;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  r.second.field_2._8_8_ = __return_storage_ptr__;
  IRVisitor::visit_generator_root((IRVisitor *)local_238,(Generator *)this);
  uVar6 = get_num_cpus();
  cxxpool::thread_pool::thread_pool
            ((thread_pool *)
             &unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (ulong)uVar6);
  auStack_b8 = (undefined1  [8])0x0;
  tasks.
  super__Vector_base<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tasks.
  super__Vector_base<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::reserve((vector<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)auStack_b8,
            (size_type)
            unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  p_Var11 = unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Base_ptr)&unique_visitor.generator_map_) {
    do {
      r.first._M_dataplus._M_p = *(pointer *)(p_Var11 + 2);
      r.first._M_string_length = (long)&r.first.field_2 + 8;
      pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)p_Var11;
      t.
      super___basic_future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)top;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&r.first._M_string_length,*(long *)(p_Var11 + 1),
                 (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
      this_00->_M_use_count = 1;
      this_00->_M_weak_count = 1;
      this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002b57f0;
      std::
      __create_task_state<std::pair<std::__cxx11::string,std::__cxx11::string>(),std::_Bind<kratos::generate_verilog_no_pkg(kratos::Generator*,kratos::SystemVerilogCodeGenOptions)::__0(std::__cxx11::string,kratos::Generator*)>,std::allocator<int>>
                ((_Bind<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_codegen_cc:1405:13)_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*)>
                  *)(this_00 + 1),
                 (allocator<int> *)
                 &t.
                  super___basic_future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if ((undefined1 *)r.first._M_string_length != (undefined1 *)((long)&r.first.field_2 + 8)) {
        operator_delete((void *)r.first._M_string_length,r.first.field_2._8_8_ + 1);
      }
      std::
      packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>
      ::get_future((packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>
                    *)local_98);
      iVar7 = pthread_mutex_lock((pthread_mutex_t *)&pool.field_0x80);
      if (iVar7 != 0) {
        std::__throw_system_error(iVar7);
      }
      if ((char)unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_node_count ==
          '\x01') {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        t.
        super___basic_future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&r.first._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &t.
                    super___basic_future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,"push called while pool is shutting down","");
        std::runtime_error::runtime_error
                  (this_01,(string *)
                           &t.
                            super___basic_future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_state.
                            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
        *(undefined ***)this_01 = &PTR__runtime_error_002b0aa8;
        __cxa_throw(this_01,&cxxpool::thread_pool_error::typeinfo,std::runtime_error::~runtime_error
                   );
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      t.
      super___basic_future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = this_00 + 1;
      r.first._M_dataplus._M_p = (pointer)this_00;
      __args_1 = cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>::
                 operator++((infinite_counter<unsigned_long,_18446744073709551615UL> *)
                            &pool.tasks_.field_0x18);
      ppVar4 = pool.tasks_.c.
               super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ptVar3 = pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (pool.tasks_.c.
          super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          pool.tasks_.c.
          super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if ((long)pool.tasks_.c.
                  super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                  ._M_impl.super__Vector_impl_data._M_start -
            (long)pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage == 0x7fffffffffffffc0) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar12 = (long)pool.tasks_.c.
                       super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                       ._M_impl.super__Vector_impl_data._M_start -
                 (long)pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage >> 6;
        uVar8 = uVar12 + (uVar12 == 0);
        __n = uVar8 + uVar12;
        if (0x1fffffffffffffe < __n) {
          __n = 0x1ffffffffffffff;
        }
        if (CARRY8(uVar8,uVar12)) {
          __n = 0x1ffffffffffffff;
        }
        if (__n == 0) {
          ppVar9 = (priority_task *)0x0;
        }
        else {
          ppVar9 = __gnu_cxx::new_allocator<cxxpool::detail::priority_task>::allocate
                             ((new_allocator<cxxpool::detail::priority_task> *)
                              &pool.threads_.
                               super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage,__n,(void *)0x0);
        }
        std::allocator_traits<std::allocator<cxxpool::detail::priority_task>_>::
        construct<cxxpool::detail::priority_task,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src____extern_cxxpool_src_cxxpool_h:371:28),_unsigned_long_&,_cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>_&>
                  ((allocator_type *)(ppVar9 + uVar12),
                   (priority_task *)
                   &t.
                    super___basic_future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(anon_class_16_1_80eb7a8b_conflict *)0x0,(unsigned_long *)__args_1,
                   in_R8);
        pptVar2 = &pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        ppVar10 = std::
                  vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                  ::_S_do_relocate(ptVar3,ppVar4,ppVar9,pptVar2);
        ppVar10 = std::
                  vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                  ::_S_do_relocate(ppVar4,ppVar4,ppVar10 + 1,pptVar2);
        if (ptVar3 != (pointer)0x0) {
          operator_delete(ptVar3,(long)pool.tasks_.c.
                                       super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar3);
        }
        pool.tasks_.c.
        super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar9 + __n;
        pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)ppVar9;
      }
      else {
        std::allocator_traits<std::allocator<cxxpool::detail::priority_task>_>::
        construct<cxxpool::detail::priority_task,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src____extern_cxxpool_src_cxxpool_h:371:28),_unsigned_long_&,_cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>_&>
                  ((allocator_type *)
                   pool.tasks_.c.
                   super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (priority_task *)
                   &t.
                    super___basic_future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(anon_class_16_1_80eb7a8b_conflict *)0x0,(unsigned_long *)__args_1,
                   in_R8);
        ppVar10 = pool.tasks_.c.
                  super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      pool.tasks_.c.
      super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
      ._M_impl.super__Vector_impl_data._M_start = ppVar10;
      std::
      push_heap<__gnu_cxx::__normal_iterator<cxxpool::detail::priority_task*,std::vector<cxxpool::detail::priority_task,std::allocator<cxxpool::detail::priority_task>>>,std::less<cxxpool::detail::priority_task>>
                (pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage,ppVar10);
      if (r.first._M_dataplus._M_p != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)r.first._M_dataplus._M_p);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&pool.field_0x80);
      std::condition_variable::notify_one();
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      std::
      vector<std::future<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::future<std::pair<std::__cxx11::string,std::__cxx11::string>>>>
      ::emplace_back<std::future<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                ((vector<std::future<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::future<std::pair<std::__cxx11::string,std::__cxx11::string>>>>
                  *)auStack_b8,
                 (future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_98);
      if (t.
          super___basic_future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   t.
                   super___basic_future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
      p_Var11 = (_Base_ptr)
                std::_Rb_tree_increment
                          ((_Rb_tree_node_base *)
                           pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next);
    } while (p_Var11 != (_Base_ptr)&unique_visitor.generator_map_);
  }
  pfVar5 = tasks.
           super__Vector_base<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (auStack_b8 !=
      (undefined1  [8])
      tasks.
      super__Vector_base<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __return_storage_ptr___00 =
         &t.
          super___basic_future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
    this_02 = auStack_b8;
    do {
      std::
      future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::get((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)__return_storage_ptr___00,
            (future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_02);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)r.second.field_2._8_8_,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)__return_storage_ptr___00);
      if ((size_type *)r.first.field_2._8_8_ != &r.second._M_string_length) {
        operator_delete((void *)r.first.field_2._8_8_,r.second._M_string_length + 1);
      }
      if (t.
          super___basic_future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&r.first._M_string_length) {
        operator_delete(t.
                        super___basic_future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi,r.first._M_string_length + 1);
      }
      this_02 = (undefined1  [8])((long)this_02 + 0x10);
    } while (this_02 != (undefined1  [8])pfVar5);
  }
  track_generators((Generator *)this);
  std::
  vector<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)auStack_b8);
  cxxpool::thread_pool::~thread_pool
            ((thread_pool *)
             &unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_238 = (undefined1  [8])&PTR_visit_root_002b5690;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
               *)&unique_visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  local_238 = (undefined1  [8])&PTR_visit_root_002b0528;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&unique_visitor.super_IRVisitor.level);
  return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)r.second.field_2._8_8_;
}

Assistant:

std::map<std::string, std::string> generate_verilog_no_pkg(Generator* top,
                                                           SystemVerilogCodeGenOptions options) {
    // this pass assumes that all the generators has been uniquified
    std::map<std::string, std::string> result;
    // first get all the unique generators
    UniqueGeneratorVisitor unique_visitor;
    // this can be parallelized
    unique_visitor.visit_generator_root(top);
    auto const& generator_map = unique_visitor.generator_map();
    // codegen in parallel
    uint32_t num_cpus = get_num_cpus();
    cxxpool::thread_pool pool{num_cpus};
    std::vector<std::future<std::pair<std::string, std::string>>> tasks;
    tasks.reserve(generator_map.size());
    for (const auto& [module_name, module_gen] : generator_map) {
        auto t = pool.push(
            [&options](const std::string& name, Generator* g) {
                SystemVerilogCodeGen codegen(g, options);
                return std::pair(name, codegen.str());
            },
            module_name, module_gen);
        tasks.emplace_back(std::move(t));
    }
    for (auto& t : tasks) {
        auto r = t.get();
        result.emplace(r);
    }

    track_generators(top);
    return result;
}